

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

void k053260_alloc_rom(void *chip,UINT32 memsize)

{
  UINT32 UVar1;
  void *pvVar2;
  k053260_state *info;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 0xd0) != memsize) {
    pvVar2 = realloc(*(void **)((long)chip + 200),(ulong)memsize);
    *(void **)((long)chip + 200) = pvVar2;
    *(UINT32 *)((long)chip + 0xd0) = memsize;
    UVar1 = pow2_mask(memsize);
    *(UINT32 *)((long)chip + 0xd4) = UVar1;
    memset(*(void **)((long)chip + 200),0xff,(ulong)memsize);
  }
  return;
}

Assistant:

static void k053260_alloc_rom(void* chip, UINT32 memsize)
{
	k053260_state *info = (k053260_state *)chip;
	
	if (info->rom_size == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->rom_size = memsize;
	info->rom_mask = pow2_mask(memsize);
	memset(info->rom, 0xFF, memsize);
	
	return;
}